

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O3

void __thiscall
duckdb::IOException::IOException<unsigned_long,unsigned_long>
          (IOException *this,string *msg,unsigned_long params,unsigned_long params_1)

{
  unsigned_long in_R8;
  string local_30;
  
  Exception::ConstructMessage<unsigned_long,unsigned_long>
            (&local_30,(Exception *)msg,(string *)params,params_1,in_R8);
  IOException(this,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

explicit IOException(const string &msg, ARGS... params) : IOException(ConstructMessage(msg, params...)) {
	}